

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::HasOwnPropertyNoHostObjectForHeapEnum
               (Var instance,PropertyId propertyId,ScriptContext *requestContext,Var *getter,
               Var *setter)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  PropertyQueryFlags PVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  DynamicObject *this;
  JavascriptLibrary *pJVar8;
  UndeclaredBlockVariable *local_48;
  Var value;
  Var *local_38;
  
  value = setter;
  local_38 = getter;
  bVar2 = VarIs<Js::RecyclableObject>(instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x6c7,"(!TaggedNumber::Is(instance))",
                                "HasOwnPropertyNoHostObjectForHeapEnum int passed");
    if (!bVar2) goto LAB_00ab6f6c;
    *puVar6 = 0;
  }
  pRVar7 = VarTo<Js::RecyclableObject>(instance);
  bVar2 = StaticType::Is(((pRVar7->type).ptr)->typeId);
  if (bVar2) {
    return 0;
  }
  *(undefined8 *)value = 0;
  *local_38 = (Var)0x0;
  this = VarTo<Js::DynamicObject>(instance);
  bVar2 = Memory::Recycler::IsHeapEnumInProgress
                    (((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                      super_JavascriptLibraryBase).scriptContext.ptr)->recycler);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x6d0,"(dynamicObject->GetScriptContext()->IsHeapEnumInProgress())"
                                ,"dynamicObject->GetScriptContext()->IsHeapEnumInProgress()");
    if (!bVar2) {
LAB_00ab6f6c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  iVar3 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0xf])(this);
  if (iVar3 == 0) {
    iVar3 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x15])
                      (pRVar7,(ulong)(uint)propertyId,local_38,value,requestContext);
    if (iVar3 != 0) {
      return 1;
    }
    local_48 = (UndeclaredBlockVariable *)0x0;
    iVar3 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x12])
                      (pRVar7,instance,(ulong)(uint)propertyId,&local_48,0,requestContext);
    if (iVar3 != 1) {
      return 0;
    }
    pJVar8 = (requestContext->super_ScriptContextBase).javascriptLibrary;
  }
  else {
    BVar4 = DynamicObject::GetAccessors(this,propertyId,local_38,(Var *)value,requestContext);
    if (BVar4 != 0) {
      return 1;
    }
    local_48 = (UndeclaredBlockVariable *)0x0;
    PVar5 = DynamicObject::GetPropertyQuery
                      (this,instance,propertyId,&local_48,(PropertyValueInfo *)0x0,requestContext);
    if (PVar5 != Property_Found) {
      return 0;
    }
    pJVar8 = (requestContext->super_ScriptContextBase).javascriptLibrary;
  }
  if ((pJVar8->undeclBlockVarSentinel).ptr == local_48) {
    bVar2 = VarIs<Js::ActivationObject>(instance);
    if (bVar2) {
      return 0;
    }
    bVar2 = VarIs<Js::RootObjectBase>(instance);
    if (bVar2) {
      return 0;
    }
  }
  return 1;
}

Assistant:

BOOL JavascriptOperators::HasOwnPropertyNoHostObjectForHeapEnum(Var instance, PropertyId propertyId, ScriptContext* requestContext, Var& getter, Var& setter)
    {
        AssertMsg(!TaggedNumber::Is(instance), "HasOwnPropertyNoHostObjectForHeapEnum int passed");

        RecyclableObject * object = VarTo<RecyclableObject>(instance);
        if (StaticType::Is(object->GetTypeId()))
        {
            return FALSE;
        }
        getter = setter = NULL;
        DynamicObject* dynamicObject = VarTo<DynamicObject>(instance);
        Assert(dynamicObject->GetScriptContext()->IsHeapEnumInProgress());
        if (dynamicObject->UseDynamicObjectForNoHostObjectAccess())
        {
            if (!dynamicObject->DynamicObject::GetAccessors(propertyId, &getter, &setter, requestContext))
            {
                Var value = nullptr;
                if (!JavascriptConversion::PropertyQueryFlagsToBoolean(dynamicObject->DynamicObject::GetPropertyQuery(instance, propertyId, &value, NULL, requestContext)) ||
                    (requestContext->IsUndeclBlockVar(value) && (VarIs<ActivationObject>(instance) || VarIs<RootObjectBase>(instance))))
                {
                    return FALSE;
                }
            }
        }
        else
        {
            if (!object->GetAccessors(propertyId, &getter, &setter, requestContext))
            {
                Var value = nullptr;
                if (!object->GetProperty(instance, propertyId, &value, NULL, requestContext) ||
                    (requestContext->IsUndeclBlockVar(value) && (VarIs<ActivationObject>(instance) || VarIs<RootObjectBase>(instance))))
                {
                    return FALSE;
                }
            }
        }
        return TRUE;
    }